

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O2

int ffparsecompspec(fitsfile *fptr,char *compspec,int *status)

{
  char *__s1;
  ushort *puVar1;
  double dVar2;
  byte bVar3;
  int iVar4;
  ushort **ppuVar5;
  long lVar6;
  ulong uVar7;
  byte bVar8;
  ulong uVar9;
  char *pcVar10;
  byte *pbVar11;
  byte *pbVar12;
  float fVar13;
  byte *local_90;
  uint local_84;
  undefined4 local_80;
  float local_7c;
  float local_78;
  int local_74;
  fitsfile *local_70;
  long tilesize [6];
  
  tilesize[4] = 0;
  tilesize[5] = 0;
  tilesize[2] = 0;
  tilesize[3] = 0;
  tilesize[0] = 0;
  tilesize[1] = 0;
  __s1 = compspec + -1;
  do {
    pcVar10 = __s1;
    __s1 = pcVar10 + 1;
  } while (pcVar10[1] == ' ');
  iVar4 = strncmp(__s1,"compress",8);
  if ((iVar4 != 0) && (iVar4 = strncmp(__s1,"COMPRESS",8), iVar4 != 0)) goto LAB_0012d132;
  pbVar11 = (byte *)(pcVar10 + 10);
  while( true ) {
    pbVar12 = pbVar11 + -1;
    bVar3 = pbVar11[-1];
    uVar9 = (ulong)bVar3;
    if (bVar3 != 0x20) break;
    pbVar11 = pbVar11 + 1;
  }
  if (bVar3 == 0x47) {
LAB_0012ce41:
    pbVar12 = pbVar11 + -1;
    while ((0x3b < (byte)uVar9 || ((0x800000100000001U >> (uVar9 & 0x3f) & 1) == 0))) {
      pbVar11 = pbVar12 + 1;
      pbVar12 = pbVar12 + 1;
      uVar9 = (ulong)*pbVar11;
    }
    local_74 = 0x15;
LAB_0012cee3:
    local_80 = 0;
    local_84 = 0;
    pbVar11 = pbVar12;
  }
  else {
    if (bVar3 != 0x48) {
      if (bVar3 == 0x50) {
LAB_0012ce23:
        pbVar12 = pbVar11 + -1;
        while ((0x3b < (byte)uVar9 || ((0x800000100000001U >> (uVar9 & 0x3f) & 1) == 0))) {
          pbVar11 = pbVar12 + 1;
          pbVar12 = pbVar12 + 1;
          uVar9 = (ulong)*pbVar11;
        }
        local_74 = 0x1f;
      }
      else {
        local_74 = 0xb;
        if (bVar3 != 0x52) {
          if (bVar3 == 0x67) goto LAB_0012ce41;
          if (bVar3 == 0x68) goto LAB_0012ce6c;
          if (bVar3 != 0x72) {
            if (bVar3 == 0x70) goto LAB_0012ce23;
            goto LAB_0012cee3;
          }
        }
        pbVar12 = pbVar11 + -1;
        while ((0x3b < (byte)uVar9 || ((0x800000100000001U >> (uVar9 & 0x3f) & 1) == 0))) {
          pbVar11 = pbVar12 + 1;
          pbVar12 = pbVar12 + 1;
          uVar9 = (ulong)*pbVar11;
        }
      }
      goto LAB_0012cee3;
    }
LAB_0012ce6c:
    bVar8 = *pbVar11;
    bVar3 = bVar8 + 0xad;
    while ((0x3b < bVar8 || ((0x800000100000001U >> ((ulong)bVar8 & 0x3f) & 1) == 0))) {
      bVar8 = pbVar11[1];
      pbVar11 = pbVar11 + 1;
    }
    local_84 = (uint)((bVar3 & 0xdf) == 0);
    local_74 = 0x29;
    local_80 = 1;
  }
  pbVar11 = pbVar11 + -1;
  do {
    pbVar12 = pbVar11 + 1;
    pbVar11 = pbVar11 + 1;
  } while (*pbVar12 == 0x20);
  local_90 = pbVar11;
  ppuVar5 = __ctype_b_loc();
  puVar1 = *ppuVar5;
  bVar3 = *pbVar11;
  for (uVar9 = 0; ((*(byte *)((long)puVar1 + (long)(char)bVar3 * 2 + 1) & 8) != 0 && (uVar9 < 9));
      uVar9 = uVar9 + 1) {
    lVar6 = atol((char *)pbVar11);
    tilesize[uVar9] = lVar6;
    pbVar12 = pbVar11 + -1;
    do {
      pbVar11 = pbVar12;
      pbVar12 = pbVar11 + 1;
    } while ((*(byte *)((long)puVar1 + (long)(char)pbVar11[1] * 2 + 1) & 8) != 0);
    uVar7 = (ulong)(pbVar11[1] == 0x2c);
    do {
      bVar3 = pbVar11[uVar7 + 1];
      pbVar11 = pbVar11 + 1;
    } while (bVar3 == 0x20);
    pbVar11 = pbVar11 + uVar7;
  }
  if (bVar3 == 0x3b) {
    do {
      local_90 = pbVar11 + 1;
      bVar3 = *local_90;
      pbVar11 = local_90;
    } while (bVar3 == 0x20);
    local_78 = 0.0;
    fVar13 = -99.0;
    iVar4 = 1;
    local_70 = fptr;
    do {
      if (bVar3 == 0x51) {
LAB_0012d00b:
        pbVar11 = local_90 + 1;
        bVar3 = local_90[1];
        if (bVar3 == 0x30) {
          pbVar11 = local_90 + 2;
          iVar4 = -1;
        }
        else if ((bVar3 == 0x7a) || (bVar3 == 0x5a)) {
          pbVar11 = local_90 + 2;
          iVar4 = 2;
        }
        local_90 = pbVar11 + -1;
        do {
          pbVar11 = local_90 + 1;
          local_90 = local_90 + 1;
        } while (*pbVar11 == 0x20);
        dVar2 = strtod((char *)local_90,(char **)&local_90);
        for (; (*local_90 == 0x2c || (*local_90 == 0x20)); local_90 = local_90 + 1) {
        }
        fVar13 = (float)dVar2;
      }
      else {
        if (bVar3 != 0x53) {
          if (bVar3 == 0x71) goto LAB_0012d00b;
          if (bVar3 != 0x73) goto LAB_0012d0a8;
        }
        do {
          pbVar11 = local_90 + 1;
          local_90 = local_90 + 1;
        } while (*pbVar11 == 0x20);
        local_7c = fVar13;
        dVar2 = strtod((char *)local_90,(char **)&local_90);
        for (; (*local_90 == 0x2c || (*local_90 == 0x20)); local_90 = local_90 + 1) {
        }
        local_78 = (float)dVar2;
        fVar13 = local_7c;
      }
      bVar3 = *local_90;
    } while( true );
  }
  local_78 = 0.0;
  local_7c = -99.0;
  iVar4 = 1;
LAB_0012d0bb:
  fits_set_compression_type(fptr,local_74,status);
  fits_set_tile_dim(fptr,6,tilesize,status);
  if ((char)local_80 != '\0') {
    fits_set_hcomp_scale(fptr,local_78,status);
    fits_set_hcomp_smooth(fptr,local_84,status);
  }
  if ((local_7c != -99.0) || (NAN(local_7c))) {
    fits_set_quantize_level(fptr,local_7c,status);
    fits_set_quantize_method(fptr,iVar4,status);
  }
  return *status;
LAB_0012d0a8:
  fptr = local_70;
  local_7c = fVar13;
  if (bVar3 != 0) {
LAB_0012d132:
    *status = 0x7d;
    return 0x7d;
  }
  goto LAB_0012d0bb;
}

Assistant:

int ffparsecompspec(fitsfile *fptr,  /* I - FITS file pointer               */
           char *compspec,     /* I - image compression specification */
           int *status)          /* IO - error status                       */
/*
  Parse the image compression specification that was give in square brackets
  following the output FITS file name, as in these examples:

    myfile.fits[compress]  - default Rice compression, row by row 
    myfile.fits[compress TYPE] -  the first letter of TYPE defines the
                                  compression algorithm:
                                   R = Rice
                                   G = GZIP
                                   H = HCOMPRESS
                                   HS = HCOMPRESS (with smoothing)
				   B - BZIP2
                                   P = PLIO

    myfile.fits[compress TYPE 100,100] - the numbers give the dimensions
                                         of the compression tiles.  Default
                                         is NAXIS1, 1, 1, ...

       other optional parameters may be specified following a semi-colon 
       
    myfile.fits[compress; q 8.0]          q specifies the floating point 
    mufile.fits[compress TYPE; q -.0002]        quantization level;
    myfile.fits[compress TYPE 100,100; q 10, s 25]  s specifies the HCOMPRESS
                                                     integer scaling parameter

The compression parameters are saved in the fptr->Fptr structure for use
when writing FITS images.

*/
{
    char *ptr1;

    /* initialize with default values */
    int ii, compresstype = RICE_1, smooth = 0;
    int quantize_method = SUBTRACTIVE_DITHER_1;
    long tilesize[MAX_COMPRESS_DIM] = {0,0,0,0,0,0};
    float qlevel = -99., scale = 0.;
    
    ptr1 = compspec;
    while (*ptr1 == ' ')    /* ignore leading blanks */
           ptr1++;

    if (strncmp(ptr1, "compress", 8) && strncmp(ptr1, "COMPRESS", 8) )
    {
       /* apparently this string does not specify compression parameters */
       return(*status = URL_PARSE_ERROR);
    }

    ptr1 += 8;
    while (*ptr1 == ' ')    /* ignore leading blanks */
           ptr1++;

    /* ========================= */
    /* look for compression type */
    /* ========================= */

    if (*ptr1 == 'r' || *ptr1 == 'R')
    {
        compresstype = RICE_1;
        while (*ptr1 != ' ' && *ptr1 != ';' && *ptr1 != '\0') 
           ptr1++;
    }
    else if (*ptr1 == 'g' || *ptr1 == 'G')
    {
        compresstype = GZIP_1;
        while (*ptr1 != ' ' && *ptr1 != ';' && *ptr1 != '\0') 
           ptr1++;

    }
/*
    else if (*ptr1 == 'b' || *ptr1 == 'B')
    {
        compresstype = BZIP2_1;
        while (*ptr1 != ' ' && *ptr1 != ';' && *ptr1 != '\0') 
           ptr1++;

    }
*/
    else if (*ptr1 == 'p' || *ptr1 == 'P')
    {
        compresstype = PLIO_1;
        while (*ptr1 != ' ' && *ptr1 != ';' && *ptr1 != '\0') 
           ptr1++;
    }
    else if (*ptr1 == 'h' || *ptr1 == 'H')
    {
        compresstype = HCOMPRESS_1;
        ptr1++;
        if (*ptr1 == 's' || *ptr1 == 'S')
           smooth = 1;  /* apply smoothing when uncompressing HCOMPRESSed image */

        while (*ptr1 != ' ' && *ptr1 != ';' && *ptr1 != '\0') 
           ptr1++;
    }

    /* ======================== */
    /* look for tile dimensions */
    /* ======================== */

    while (*ptr1 == ' ')    /* ignore leading blanks */
           ptr1++;

    ii = 0;
    while (isdigit( (int) *ptr1) && ii < 9)
    {
       tilesize[ii] = atol(ptr1);  /* read the integer value */
       ii++;

       while (isdigit((int) *ptr1))    /* skip over the integer */
           ptr1++;

       if (*ptr1 == ',')
           ptr1++;   /* skip over the comma */
          
       while (*ptr1 == ' ')    /* ignore leading blanks */
           ptr1++;
    }

    /* ========================================================= */
    /* look for semi-colon, followed by other optional parameters */
    /* ========================================================= */

    if (*ptr1 == ';') {
        ptr1++;
        while (*ptr1 == ' ')    /* ignore leading blanks */
           ptr1++;

          while (*ptr1 != 0) {  /* haven't reached end of string yet */

              if (*ptr1 == 's' || *ptr1 == 'S') {
                  /* this should be the HCOMPRESS "scale" parameter; default = 1 */
	   
                  ptr1++;
                  while (*ptr1 == ' ')    /* ignore leading blanks */
                      ptr1++;

                  scale = (float) strtod(ptr1, &ptr1);

                  while (*ptr1 == ' ' || *ptr1 == ',') /* skip over blanks or comma */
                     ptr1++;

            } else if (*ptr1 == 'q' || *ptr1 == 'Q') {
                /* this should be the floating point quantization parameter */

                  ptr1++;
                  if (*ptr1 == 'z' || *ptr1 == 'Z') {
                      /* use the subtractive_dither_2 option */
                      quantize_method = SUBTRACTIVE_DITHER_2;
                      ptr1++;
		  } else if (*ptr1 == '0') {
                      /* do not dither */
                      quantize_method = NO_DITHER;
                      ptr1++;
		  }

                  while (*ptr1 == ' ')    /* ignore leading blanks */
                      ptr1++;

                  qlevel = (float) strtod(ptr1, &ptr1);

                  while (*ptr1 == ' ' || *ptr1 == ',') /* skip over blanks or comma */
                     ptr1++;

            } else {
                return(*status = URL_PARSE_ERROR);
            }
        }
    }

    /* ================================= */
    /* finished parsing; save the values */
    /* ================================= */

    fits_set_compression_type(fptr, compresstype, status);
    fits_set_tile_dim(fptr, MAX_COMPRESS_DIM, tilesize, status);
 
    if (compresstype == HCOMPRESS_1) {
        fits_set_hcomp_scale (fptr, scale,  status);
        fits_set_hcomp_smooth(fptr, smooth, status);
    }

    if (qlevel != -99.) {
        fits_set_quantize_level(fptr, qlevel, status);
        fits_set_quantize_method(fptr, quantize_method, status);
    }

    return(*status);
}